

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

int get_max_allowed_ref_frames
              (AV1_COMP *cpi,int *ref_frame_flags,uint *ref_display_order_hint,
              uint cur_frame_display_index)

{
  uint uVar1;
  undefined4 in_ECX;
  int *in_RDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  uint max_allowed_refs_for_given_speed;
  uint num_refs_to_disable;
  uint max_reference_frames;
  uint local_2c;
  uint in_stack_ffffffffffffffdc;
  
  local_2c = *(uint *)(in_RDI + 0x426d4);
  uVar1 = get_num_refs_to_disable
                    (in_RSI,in_RDX,(uint *)CONCAT44(in_ECX,local_2c),in_stack_ffffffffffffffdc);
  if (7 - uVar1 < local_2c) {
    local_2c = 7 - uVar1;
  }
  return local_2c;
}

Assistant:

static inline int get_max_allowed_ref_frames(
    const AV1_COMP *cpi, const int *ref_frame_flags,
    const unsigned int *ref_display_order_hint,
    unsigned int cur_frame_display_index) {
  const unsigned int max_reference_frames =
      cpi->oxcf.ref_frm_cfg.max_reference_frames;
  const unsigned int num_refs_to_disable = get_num_refs_to_disable(
      cpi, ref_frame_flags, ref_display_order_hint, cur_frame_display_index);
  const unsigned int max_allowed_refs_for_given_speed =
      INTER_REFS_PER_FRAME - num_refs_to_disable;
  return AOMMIN(max_allowed_refs_for_given_speed, max_reference_frames);
}